

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.cpp
# Opt level: O1

bool __thiscall
sjtu::UserManager::refund_order
          (UserManager *this,OrderManager *order_manager,int n,orderType *order)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  pair<long,_bool> pVar10;
  allocator local_69;
  ulong local_68;
  long *local_60;
  long local_58;
  long local_50 [2];
  long local_40;
  undefined1 local_38;
  
  this_00 = this->UserBpTree;
  std::__cxx11::string::string((string *)&local_60,order->username,&local_69);
  if (local_58 == 0) {
    local_68 = 0;
  }
  else {
    lVar7 = 0;
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar8 = (ulong)((int)*(char *)((long)local_60 + lVar7) + 0x100);
      lVar5 = (long)(lVar5 * 0x239 + uVar8) % 0x3b800001;
      uVar6 = (long)(uVar6 * 0x301 + uVar8) % 0x3b9aca07;
      lVar7 = lVar7 + 1;
    } while (local_58 != lVar7);
    local_68 = lVar5 << 0x20 | uVar6;
  }
  pVar10 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (this_00,&local_68);
  local_40 = pVar10.first;
  local_38 = pVar10.second;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  iVar3 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (this->UserFile,&local_40);
  if (*(int *)(CONCAT44(extraout_var,iVar3) + 0x80) < n) {
    bVar9 = false;
  }
  else {
    local_68 = *(unsigned_long_long *)(CONCAT44(extraout_var,iVar3) + 0x70);
    iVar3 = n + -1;
    if (iVar3 != 0) {
      do {
        iVar4 = (*(order_manager->OrderFile->
                  super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)._vptr_FileManager_Base
                  [2])(order_manager->OrderFile,&local_68);
        local_68 = *(unsigned_long_long *)(CONCAT44(extraout_var_00,iVar4) + 0xb8);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    iVar3 = (*(order_manager->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
              _vptr_FileManager_Base[2])(order_manager->OrderFile,&local_68);
    lVar5 = CONCAT44(extraout_var_01,iVar3);
    bVar9 = *(orderstatus *)(lVar5 + 0xa8) != refunded;
    if (bVar9) {
      order->status = *(orderstatus *)(lVar5 + 0xa8);
      *(undefined4 *)(lVar5 + 0xa8) = 2;
      uVar1 = *(undefined8 *)(lVar5 + 0x2c);
      uVar2 = *(undefined8 *)(lVar5 + 0x34);
      order->date[0].month = (int)uVar1;
      order->date[0].day = (int)((ulong)uVar1 >> 0x20);
      order->date[0].hour = (int)uVar2;
      order->date[0].minute = (int)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)(lVar5 + 0x3c);
      uVar2 = *(undefined8 *)(lVar5 + 0x44);
      order->date[1].month = (int)uVar1;
      order->date[1].day = (int)((ulong)uVar1 >> 0x20);
      order->date[1].hour = (int)uVar2;
      order->date[1].minute = (int)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)(lVar5 + 0xa0);
      order->num = (int)uVar1;
      order->price = (int)((ulong)uVar1 >> 0x20);
      order->offset = *(locType *)(lVar5 + 0xb0);
      strcpy(order->trainID,(char *)(lVar5 + 0x15));
      strcpy(order->station[0],(char *)(lVar5 + 0x4c));
      strcpy(order->station[1],(char *)(lVar5 + 0x75));
      (*(order_manager->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
        _vptr_FileManager_Base[3])(order_manager->OrderFile,lVar5 + 0xb0);
    }
  }
  return bVar9;
}

Assistant:

bool UserManager::refund_order(OrderManager *order_manager, int n, orderType *order) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(order->username));
            userType *cur = UserFile->read(tmp.first);
            if (cur->order_count < n) return false;
            else {
                locType tmpticket = cur->head;
                while(-- n) {
                    auto ret = order_manager->OrderFile->read(tmpticket);   //std::pair<*orderType , locType>
                    tmpticket = ret -> second;
                }
                auto now = order_manager->OrderFile->read(tmpticket);
                if (now -> first.status == refunded) return false;
                order -> status = now -> first.status , now -> first.status = refunded;
                order -> date[0] = now -> first.date[0] , order -> date[1] = now -> first.date[1];
                order -> num = now -> first.num , order -> price = now -> first.price , order -> offset = now -> first.offset;
                strcpy(order -> trainID , now -> first.trainID);
                strcpy(order -> station[0] , now -> first.station[0]) , strcpy(order -> station[1] , now -> first.station[1]);
                order_manager->OrderFile->save(now -> first.offset);
                return true;
            }
        }